

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O1

int print_mm_packet(int direction,mm_packet_t *pkt)

{
  byte bVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  
  pcVar2 = "T<--M";
  if (direction == 2) {
    pcVar2 = "T-->M";
  }
  pcVar3 = "TX";
  if (direction == 2) {
    pcVar3 = "RX";
  }
  bVar1 = (pkt->hdr).flags;
  pcVar5 = "DIS";
  if ((bVar1 & 0x20) == 0) {
    pcVar5 = "---";
  }
  pcVar6 = "ERR";
  if ((bVar1 & 0x10) == 0) {
    pcVar6 = "OK ";
  }
  pcVar7 = "ACK";
  if ((bVar1 & 8) == 0) {
    pcVar7 = "REQ";
  }
  pcVar8 = "RETRY";
  if ((bVar1 & 4) == 0) {
    pcVar8 = " --- ";
  }
  iVar4 = 0;
  printf("\n%s %s: flags=%02x [ %s | %s | %s | %s | Seq:%d], len=%3d (datalen=%3d), crc=%04x.\n",
         pcVar2,pcVar3,(ulong)bVar1,pcVar5,pcVar6,pcVar7,pcVar8,(ulong)(bVar1 & 3),
         (ulong)(pkt->hdr).pktlen,(ulong)pkt->payload_len,(ulong)(pkt->trailer).crc);
  if ((pkt->trailer).crc != pkt->calculated_crc) {
    printf("\t*** CRC Error, calculated: %04x ***\n");
    iVar4 = -1;
  }
  if ((pkt->trailer).end != '\x03') {
    printf("\t*** Framing Error, expected STOP=0x03, got STOP=%02x ***\n");
    iVar4 = -1;
  }
  if ((ulong)pkt->payload_len != 0) {
    dump_hex(pkt->payload,(ulong)pkt->payload_len);
  }
  return iVar4;
}

Assistant:

int print_mm_packet(int direction, mm_packet_t *pkt) {
    int status = 0;

    /* Decode flags: bit 3 = Req/Ack, 2=Retry, 1:0=Sequence. */
    printf("\n%s %s: flags=%02x [ %s | %s | %s | %s | Seq:%d], len=%3d (datalen=%3d), crc=%04x.\n",
           (direction == RX) ? "T-->M" : "T<--M",
           (direction == RX) ? "RX" : "TX",
           pkt->hdr.flags,
           (pkt->hdr.flags & FLAG_DISCONNECT) ? "DIS" : "---",
           (pkt->hdr.flags & FLAG_STATUS) ? "ERR" : "OK ",
           (pkt->hdr.flags & FLAG_ACK) ? "ACK" : "REQ",
           (pkt->hdr.flags & FLAG_RETRY) ? "RETRY" : " --- ",
           (pkt->hdr.flags & FLAG_SEQUENCE),
           pkt->hdr.pktlen, pkt->payload_len, LE16(pkt->trailer.crc));

    if (pkt->trailer.crc != pkt->calculated_crc) {
        printf("\t*** CRC Error, calculated: %04x ***\n", pkt->calculated_crc);
        status = -1;
    }

    if (pkt->trailer.end != STOP_BYTE) {
        printf("\t*** Framing Error, expected STOP=0x03, got STOP=%02x ***\n", pkt->trailer.end);
        status = -1;
    }

    if (pkt->payload_len > 0) {
        dump_hex(pkt->payload, pkt->payload_len);
    }

    return status;
}